

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

BrOn * __thiscall
wasm::Builder::makeBrOn(Builder *this,BrOnOp op,Name name,Expression *ref,Type castType)

{
  BrOn *this_00;
  BrOn *ret;
  Expression *ref_local;
  BrOnOp op_local;
  Builder *this_local;
  Type castType_local;
  Name name_local;
  
  castType_local.id = name.super_IString.str._M_len;
  this_00 = MixedArena::alloc<wasm::BrOn>(&this->wasm->allocator);
  this_00->op = op;
  wasm::Name::operator=(&this_00->name,(Name *)&castType_local);
  this_00->ref = ref;
  (this_00->castType).id = castType.id;
  BrOn::finalize(this_00);
  return this_00;
}

Assistant:

BrOn*
  makeBrOn(BrOnOp op, Name name, Expression* ref, Type castType = Type::none) {
    auto* ret = wasm.allocator.alloc<BrOn>();
    ret->op = op;
    ret->name = name;
    ret->ref = ref;
    ret->castType = castType;
    ret->finalize();
    return ret;
  }